

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O3

int __thiscall CVmTimeZone::init(CVmTimeZone *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  vmtz_rule *this_00;
  vmtz_ttype *pvVar5;
  char *__dest_00;
  
  this->trans_ = (vmtz_trans *)0x0;
  this->trans_cnt_ = 0;
  this->rule_ = (vmtz_rule *)0x0;
  this->rule_cnt_ = 0;
  sVar3 = strlen((char *)(ctx + 8));
  sVar4 = strlen((char *)(ctx + 0x18));
  __dest = (char *)operator_new__(sVar4 + sVar3 + 2);
  this->abbr_ = __dest;
  strcpy(__dest,(char *)(ctx + 8));
  __dest_00 = __dest + sVar3 + 1;
  strcpy(__dest_00,(char *)(ctx + 0x18));
  if ((((*(int *)(ctx + 0x28) == 0) && (*(int *)(ctx + 0x2c) == 0)) && (*(int *)(ctx + 0x30) == 0))
     || (((*(int *)(ctx + 0x40) == 0 && (*(int *)(ctx + 0x44) == 0)) && (*(int *)(ctx + 0x48) == 0))
        )) {
    pvVar5 = (vmtz_ttype *)operator_new__(0x10);
    this->ttype_ = pvVar5;
    this->ttype_cnt_ = 1;
    pvVar5->save = 0;
    if (*(int *)(ctx + 0x58) == 0) {
      pvVar5->gmtofs = *(int *)ctx * 1000;
      pvVar5->fmt = __dest;
    }
    else {
      pvVar5->gmtofs = *(int *)(ctx + 4) * 1000;
      pvVar5->fmt = __dest_00;
    }
  }
  else {
    this->rule_cnt_ = 2;
    this_00 = (vmtz_rule *)operator_new__(0x40);
    this->rule_ = this_00;
    vmtz_rule::set(this_00,(os_tzrule_t *)(ctx + 0x28),__dest_00,*(int *)ctx * 1000,
                   (*(int *)(ctx + 4) - *(int *)ctx) * 1000);
    vmtz_rule::set(this->rule_ + 1,(os_tzrule_t *)(ctx + 0x40),__dest,*(int *)ctx * 1000,0);
    pvVar5 = (vmtz_ttype *)operator_new__(0x20);
    this->ttype_ = pvVar5;
    this->ttype_cnt_ = 2;
    iVar1 = *(int *)ctx;
    pvVar5->gmtofs = iVar1 * 1000;
    pvVar5->save = 0;
    pvVar5->fmt = __dest;
    iVar2 = *(int *)(ctx + 4);
    pvVar5[1].gmtofs = iVar2 * 1000;
    pvVar5[1].save = (iVar2 - iVar1) * 1000;
    pvVar5[1].fmt = __dest_00;
  }
  this->country_[0] = '\0';
  this->coords_[0] = '\0';
  this->desc_ = (char *)0x0;
  return 0;
}

Assistant:

void CVmTimeZone::init(const os_tzinfo_t *desc)
{    
    /* we don't have any transitions or rules */
    trans_ = 0;
    trans_cnt_ = 0;
    rule_ = 0;
    rule_cnt_ = 0;

    /* make a copy of our one abbreviation(s) */
    size_t std_abbr_len = strlen(desc->std_abbr);
    size_t dst_abbr_len = strlen(desc->dst_abbr);
    abbr_ = new char[std_abbr_len + dst_abbr_len + 2];

    char *std_abbr = abbr_;
    strcpy(std_abbr, desc->std_abbr);

    char *dst_abbr = abbr_ + std_abbr_len + 1;
    strcpy(dst_abbr, desc->dst_abbr);

    /* if rules for the start/end dates are specified, use them */
    if ((desc->dst_start.jday != 0
         || desc->dst_start.yday != 0
         || desc->dst_start.month != 0)
        && (desc->dst_end.jday != 0
            || desc->dst_end.yday != 0
            || desc->dst_end.month != 0))
    {
        /* we have start/end rules - create our copies */
        rule_cnt_ = 2;
        rule_ = new vmtz_rule[2];

        /* 
         *   Set the rules from the OS description.  Note that the OS
         *   description gives offsets in seconds, whereas we store
         *   everything in milliseconds. 
         */
        rule_[0].set(&desc->dst_start, dst_abbr, desc->std_ofs*1000,
                     (desc->dst_ofs - desc->std_ofs)*1000);
        rule_[1].set(&desc->dst_end, std_abbr, desc->std_ofs*1000, 0);

        /*
         *   allocate space for two types - one for standard time, one for
         *   daylight time
         */
        ttype_ = new vmtz_ttype[2];
        ttype_cnt_ = 2;
        
        /* set up the standard time information */
        ttype_[0].gmtofs = desc->std_ofs * 1000;
        ttype_[0].save = 0;
        ttype_[0].fmt = std_abbr;
        
        /* set up the daylight time information */
        ttype_[1].gmtofs = desc->dst_ofs * 1000;
        ttype_[1].save = (desc->dst_ofs - desc->std_ofs) * 1000;
        ttype_[1].fmt = dst_abbr;
    }
    else
    {
        /*
         *   There are no transition rules, so we only have use for whichever
         *   setting is currently in effect. 
         */
        ttype_ = new vmtz_ttype[1];
        ttype_cnt_ = 1;

        /* use the current setting only */
        ttype_[0].save = 0;
        if (desc->is_dst)
        {
            ttype_[0].gmtofs = desc->dst_ofs * 1000;
            ttype_[0].fmt = dst_abbr;
        }
        else
        {
            ttype_[0].gmtofs = desc->std_ofs * 1000;
            ttype_[0].fmt = std_abbr;
        }
    }

    /* we have no descriptive information */
    country_[0] = '\0';
    coords_[0] = '\0';
    desc_ = 0;
}